

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigation.cpp
# Opt level: O3

void __thiscall despot::Navigation::Init(Navigation *this,istream *is)

{
  int *piVar1;
  int *piVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  *this_02;
  double dVar3;
  pointer pdVar4;
  pointer pvVar5;
  long lVar6;
  byte bVar7;
  istream *piVar8;
  istream *this_03;
  State *pSVar9;
  unsigned_long uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  double dVar19;
  string tok;
  long local_b8;
  State local_78 [32];
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  double local_38;
  
  local_58 = &local_48;
  local_50 = 0;
  local_48 = 0;
  piVar8 = std::operator>>(is,(string *)&local_58);
  piVar8 = std::operator>>(piVar8,(string *)&local_58);
  piVar1 = &this->ysize_;
  this_03 = (istream *)std::istream::operator>>((istream *)piVar8,piVar1);
  piVar2 = &this->xsize_;
  std::istream::operator>>(this_03,piVar2);
  std::vector<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>::resize
            (&this->states_,((long)this->ysize_ * (long)this->xsize_ + 1) * (long)flag_size_);
  this_00 = &this->obs_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (this_00,(long)this->ysize_ * (long)this->xsize_ + 1);
  this_01 = &this->trap_prob_;
  std::vector<double,_std::allocator<double>_>::resize
            (this_01,(long)this->ysize_ * (long)this->xsize_ + 1);
  iVar14 = this->xsize_;
  iVar17 = this->ysize_;
  iVar18 = iVar17 * iVar14;
  this->trap_pos_ = iVar18;
  if (0 < iVar17) {
    iVar18 = 0;
    do {
      if (0 < iVar14) {
        iVar17 = 0;
        do {
          iVar14 = iVar14 * iVar18 + iVar17;
          if (0 < flag_size_) {
            lVar12 = 0;
            iVar16 = flag_size_;
            do {
              pSVar9 = (State *)operator_new(0x20);
              despot::State::State(pSVar9);
              *(undefined ***)pSVar9 = &PTR__State_0010eaa0;
              *(int *)(pSVar9 + 0xc) = iVar16 * iVar14 + (int)lVar12;
              iVar16 = flag_size_;
              (this->states_).
              super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar14 * flag_size_ + lVar12] =
                   (NavigationState *)pSVar9;
              lVar12 = lVar12 + 1;
            } while ((int)lVar12 < iVar16);
          }
          std::istream::_M_extract<double>((double *)is);
          pdVar4 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar3 = pdVar4[iVar14];
          if ((dVar3 == -1.0) && (!NAN(dVar3))) {
            this->goal_pos_ = iVar14;
            pdVar4[iVar14] = 0.0;
          }
          if (iVar17 == 0 && iVar18 == 0) {
            uVar10 = 0;
          }
          else if ((iVar18 != 0) || (uVar10 = 1, iVar17 != *piVar2 + -1)) {
            uVar10 = 2;
            if ((iVar18 != *piVar1 + -1 || iVar17 != 0) &&
               ((iVar18 != *piVar1 + -1 || (uVar10 = 3, iVar17 != *piVar2 + -1)))) {
              uVar10 = 4;
            }
          }
          (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar14] = uVar10;
          iVar17 = iVar17 + 1;
          iVar14 = *piVar2;
        } while (iVar17 < iVar14);
        iVar17 = *piVar1;
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 < iVar17);
    iVar18 = this->trap_pos_;
  }
  (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[iVar18] = 4;
  (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start[iVar18] = 1.0;
  if (0 < flag_size_) {
    lVar12 = 0;
    iVar14 = flag_size_;
    do {
      pSVar9 = (State *)operator_new(0x20);
      despot::State::State(pSVar9);
      *(undefined ***)pSVar9 = &PTR__State_0010eaa0;
      *(int *)(pSVar9 + 0xc) = iVar18 * iVar14 + (int)lVar12;
      iVar14 = flag_size_;
      iVar18 = this->trap_pos_;
      (this->states_).
      super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar18 * flag_size_ + lVar12] =
           (NavigationState *)pSVar9;
      lVar12 = lVar12 + 1;
    } while ((int)lVar12 < iVar14);
  }
  this_02 = &this->transition_probabilities_;
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::resize(this_02,(long)(this->states_).
                         super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->states_).
                         super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
  if ((this->states_).
      super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->states_).
      super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar13 = 0;
    do {
      pvVar5 = (this->transition_probabilities_).
               super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar14 = (**(code **)(*(long *)this + 0x28))(this);
      std::
      vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
      ::resize(pvVar5 + uVar13,(long)iVar14);
      local_b8 = 0;
      lVar12 = 0;
      while( true ) {
        iVar14 = (**(code **)(*(long *)this + 0x28))(this);
        if (iVar14 <= lVar12) break;
        uVar11 = (uint)uVar13;
        lVar6 = (long)flag_size_;
        bVar7 = flag_bits_ & 0x1f;
        iVar14 = NextPosition(this,uVar11 >> bVar7,(ACT_TYPE)lVar12);
        uVar15 = (uint)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) %
                       lVar6);
        if (uVar15 == 1) {
          lVar6 = *(long *)&(this_02->
                            super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar13].
                            super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          if (uVar11 >> bVar7 == 0) {
            despot::State::State(local_78,flag_size_ + 3,0.49);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8),
                       local_78);
            despot::State::~State(local_78);
            lVar6 = *(long *)&(this_02->
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar13].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            despot::State::State(local_78,(*piVar2 + -2) * flag_size_ + 7,0.51);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8),
                       local_78);
          }
          else {
            despot::State::State(local_78,uVar11,1.0);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8),
                       local_78);
          }
LAB_001073d3:
          despot::State::~State(local_78);
        }
        else {
          if (uVar15 == 0) {
            lVar6 = *(long *)&(this_02->
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar13].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            if (uVar11 >> bVar7 == 0) {
              despot::State::State(local_78,1,1.0);
              std::vector<despot::State,_std::allocator<despot::State>_>::
              emplace_back<despot::State>
                        ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8)
                         ,local_78);
            }
            else {
              despot::State::State(local_78,uVar11,1.0);
              std::vector<despot::State,_std::allocator<despot::State>_>::
              emplace_back<despot::State>
                        ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8)
                         ,local_78);
            }
            goto LAB_001073d3;
          }
          if ((uVar15 & 0x7ffffffb) != 3) {
            lVar6 = *(long *)&(this_02->
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar13].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            despot::State::State(local_78,uVar11,1.0);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8),
                       local_78);
            goto LAB_001073d3;
          }
          dVar3 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[iVar14];
          dVar19 = 1.0 - dVar3;
          if (0.0 < dVar19) {
            lVar6 = *(long *)&(this_02->
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar13].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            local_38 = dVar19;
            despot::State::State(local_78,flag_size_ * iVar14 + 3,dVar19 * 0.49);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8),
                       local_78);
            despot::State::~State(local_78);
            lVar6 = *(long *)&(this_02->
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar13].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            despot::State::State(local_78,iVar14 * flag_size_ + 7,local_38 * 0.51);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8),
                       local_78);
            despot::State::~State(local_78);
          }
          if (0.0 < dVar3) {
            lVar6 = *(long *)&(this->transition_probabilities_).
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar13].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            despot::State::State(local_78,flag_size_ * this->trap_pos_ + 3,dVar3 * 0.49);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8),
                       local_78);
            despot::State::~State(local_78);
            lVar6 = *(long *)&(this->transition_probabilities_).
                              super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar13].
                              super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            despot::State::State(local_78,flag_size_ * this->trap_pos_ + 7,dVar3 * 0.51);
            std::vector<despot::State,_std::allocator<despot::State>_>::emplace_back<despot::State>
                      ((vector<despot::State,_std::allocator<despot::State>_> *)(lVar6 + local_b8),
                       local_78);
            goto LAB_001073d3;
          }
        }
        lVar12 = lVar12 + 1;
        local_b8 = local_b8 + 0x18;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)(this->states_).
                                    super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->states_).
                                    super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return;
}

Assistant:

void Navigation::Init(istream& is) {
	string tok;
	is >> tok >> tok >> ysize_ >> xsize_;
	states_.resize(flag_size_ * (xsize_ * ysize_ + 1));
	obs_.resize(xsize_ * ysize_ + 1);
	trap_prob_.resize(xsize_ * ysize_ + 1);
	trap_pos_ = xsize_ * ysize_;
	for (int y = 0; y < ysize_; y++) {
		for (int x = 0; x < xsize_; x++) {
			int pos = y * xsize_ + x;
			for (int i = 0; i < flag_size_; i++)
				states_[flag_size_ * pos + i] = new NavigationState(
					flag_size_ * pos + i);

			is >> trap_prob_[pos];

			if (trap_prob_[pos] == -1) {
				goal_pos_ = pos;
				trap_prob_[pos] = 0;
			}

			if (y == 0 && x == 0)
				obs_[pos] = 0;
			else if (y == 0 && x == xsize_ - 1)
				obs_[pos] = 1;
			else if (y == ysize_ - 1 && x == 0)
				obs_[pos] = 2;
			else if (y == ysize_ - 1 && x == xsize_ - 1)
				obs_[pos] = 3;
			else
				obs_[pos] = 4;
		}
	}
	obs_[trap_pos_] = 4;
	trap_prob_[trap_pos_] = 1.0;
	for (int i = 0; i < flag_size_; i++) {
		states_[flag_size_ * trap_pos_ + i] = new NavigationState(
			flag_size_ * trap_pos_ + i);
	}

	// Build transition matrix
	transition_probabilities_.resize(states_.size());
	for (int s = 0; s < states_.size(); s++) {
		transition_probabilities_[s].resize(NumActions());

		for (int a = 0; a < NumActions(); a++) {
			int flag = s % flag_size_;
			int pos = s >> flag_bits_;
			int next_pos = NextPosition(pos, a);

			if (flag == 0) { // Transition for first step
				if (pos == 0) {
					transition_probabilities_[s][a].push_back(State(1, 1.0));
				} else { // Self transition
					transition_probabilities_[s][a].push_back(State(s, 1.0));
				}
			} else if (flag == 1) { // Transition for second step
				if (pos == 0) {
					transition_probabilities_[s][a].push_back(
						State(3 + 1 * flag_size_, 0.49));
					transition_probabilities_[s][a].push_back(
						State(7 + (xsize_ - 2) * flag_size_, 0.51));
				} else { // Self transition
					transition_probabilities_[s][a].push_back(State(s, 1.0));
				}
			} else if (flag == 3 || flag == 7) { // Transition for remaining steps
				double prob = trap_prob_[next_pos];

				if (1 - prob > 0.0) {
					transition_probabilities_[s][a].push_back(
						State(3 + next_pos * flag_size_, (1 - prob) * 0.49));
					transition_probabilities_[s][a].push_back(
						State(7 + next_pos * flag_size_, (1 - prob) * 0.51));
				}

				if (prob > 0.0) {
					transition_probabilities_[s][a].push_back(
						State(3 + trap_pos_ * flag_size_, prob * 0.49));
					transition_probabilities_[s][a].push_back(
						State(7 + trap_pos_ * flag_size_, prob * 0.51));
				}
			} else { // Self transition
				transition_probabilities_[s][a].push_back(State(s, 1.0));
			}
		}
	}

	// PrintTransitions();
}